

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_ul_setup(Curl_easy *data,_Bool sizechecked)

{
  connectdata *pcVar1;
  FILEPROTO *pFVar2;
  long lVar3;
  curl_trc_feat *pcVar4;
  int iVar5;
  CURLcode CVar6;
  size_t sVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  ftpstate newstate;
  curl_off_t cVar11;
  size_t sVar12;
  char scratch [4096];
  char local_1038 [4104];
  
  pcVar1 = data->conn;
  pFVar2 = (data->req).p.file;
  lVar10 = (data->state).resume_from;
  if (lVar10 == 0 || sizechecked) {
    if (0 < lVar10 && sizechecked) goto LAB_0012b3b1;
    if (((uint)*(undefined8 *)&(data->set).field_0x8ca >> 10 & 1) != 0) goto LAB_0012b478;
    pcVar9 = "STOR %s";
  }
  else {
    if (lVar10 < 0) {
      CVar6 = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,"SIZE %s",(pcVar1->proto).ftpc.file);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      newstate = '\x19';
      goto LAB_0012b522;
    }
LAB_0012b3b1:
    if ((data->set).seek_func != (curl_seek_callback)0x0) {
      Curl_set_in_callback(data,true);
      iVar5 = (*(data->set).seek_func)((data->set).seek_client,(data->state).resume_from,0);
      Curl_set_in_callback(data,false);
      if (iVar5 != 0) {
        if (iVar5 != 2) {
          pcVar9 = "Could not seek stream";
LAB_0012b530:
          Curl_failf(data,pcVar9);
          return CURLE_FTP_COULDNT_USE_REST;
        }
        cVar11 = (data->state).resume_from;
        lVar10 = 0;
        do {
          sVar12 = 0x1000;
          if (cVar11 - lVar10 < 0x1001) {
            sVar12 = curlx_sotouz(cVar11 - lVar10);
          }
          sVar7 = (*(data->state).fread_func)(local_1038,1,sVar12,(data->state).in);
          if (sVar12 <= sVar7 - 1) {
            pcVar9 = "Failed to read data";
            goto LAB_0012b530;
          }
          lVar10 = lVar10 + sVar7;
          cVar11 = (data->state).resume_from;
        } while (lVar10 < cVar11);
      }
    }
    lVar10 = (data->state).infilesize;
    if ((0 < lVar10) &&
       (lVar3 = (data->state).resume_from, lVar8 = lVar10 - lVar3, (data->state).infilesize = lVar8,
       lVar8 == 0 || lVar10 < lVar3)) {
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))))
      {
        Curl_infof(data,"File already completely uploaded");
      }
      Curl_xfer_setup_nop(data);
      pFVar2->fd = 2;
      newstate = '\0';
      goto LAB_0012b522;
    }
LAB_0012b478:
    pcVar9 = "APPE %s";
  }
  CVar6 = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,pcVar9,(pcVar1->proto).ftpc.file);
  if (CVar6 != CURLE_OK) {
    return CVar6;
  }
  newstate = '!';
LAB_0012b522:
  _ftp_state(data,newstate);
  return CURLE_OK;
}

Assistant:

static CURLcode ftp_state_ul_setup(struct Curl_easy *data,
                                   bool sizechecked)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct FTP *ftp = data->req.p.ftp;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  bool append = data->set.remote_append;

  if((data->state.resume_from && !sizechecked) ||
     ((data->state.resume_from > 0) && sizechecked)) {
    /* we are about to continue the uploading of a file */
    /* 1. get already existing file's size. We use the SIZE command for this
       which may not exist in the server!  The SIZE command is not in
       RFC959. */

    /* 2. This used to set REST. But since we can do append, we
       do not another ftp command. We just skip the source file
       offset and then we APPEND the rest on the file instead */

    /* 3. pass file-size number of bytes in the source file */
    /* 4. lower the infilesize counter */
    /* => transfer as usual */
    int seekerr = CURL_SEEKFUNC_OK;

    if(data->state.resume_from < 0) {
      /* Got no given size to start from, figure it out */
      result = Curl_pp_sendf(data, &ftpc->pp, "SIZE %s", ftpc->file);
      if(!result)
        ftp_state(data, FTP_STOR_SIZE);
      return result;
    }

    /* enable append */
    append = TRUE;

    /* Let's read off the proper amount of bytes from the input. */
    if(data->set.seek_func) {
      Curl_set_in_callback(data, TRUE);
      seekerr = data->set.seek_func(data->set.seek_client,
                                    data->state.resume_from, SEEK_SET);
      Curl_set_in_callback(data, FALSE);
    }

    if(seekerr != CURL_SEEKFUNC_OK) {
      curl_off_t passed = 0;
      if(seekerr != CURL_SEEKFUNC_CANTSEEK) {
        failf(data, "Could not seek stream");
        return CURLE_FTP_COULDNT_USE_REST;
      }
      /* seekerr == CURL_SEEKFUNC_CANTSEEK (cannot seek to offset) */
      do {
        char scratch[4*1024];
        size_t readthisamountnow =
          (data->state.resume_from - passed > (curl_off_t)sizeof(scratch)) ?
          sizeof(scratch) :
          curlx_sotouz(data->state.resume_from - passed);

        size_t actuallyread =
          data->state.fread_func(scratch, 1, readthisamountnow,
                                 data->state.in);

        passed += actuallyread;
        if((actuallyread == 0) || (actuallyread > readthisamountnow)) {
          /* this checks for greater-than only to make sure that the
             CURL_READFUNC_ABORT return code still aborts */
          failf(data, "Failed to read data");
          return CURLE_FTP_COULDNT_USE_REST;
        }
      } while(passed < data->state.resume_from);
    }
    /* now, decrease the size of the read */
    if(data->state.infilesize > 0) {
      data->state.infilesize -= data->state.resume_from;

      if(data->state.infilesize <= 0) {
        infof(data, "File already completely uploaded");

        /* no data to transfer */
        Curl_xfer_setup_nop(data);

        /* Set ->transfer so that we will not get any error in
         * ftp_done() because we did not transfer anything! */
        ftp->transfer = PPTRANSFER_NONE;

        ftp_state(data, FTP_STOP);
        return CURLE_OK;
      }
    }
    /* we have passed, proceed as normal */
  } /* resume_from */

  result = Curl_pp_sendf(data, &ftpc->pp, append ? "APPE %s" : "STOR %s",
                         ftpc->file);
  if(!result)
    ftp_state(data, FTP_STOR);

  return result;
}